

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int match_tzofs(date_parse_result *res,char **str,size_t *len)

{
  char cVar1;
  char *pcVar2;
  int32_t gmtofs_secs;
  int iVar3;
  int iVar4;
  CVmTimeZone *pCVar5;
  char *p;
  size_t rem;
  int ss;
  int mi;
  int hh;
  date_parse_string local_40;
  
  p = *str;
  rem = *len;
  iVar3 = match_lit(&p,&rem,"^GMT",&local_40);
  if (rem == 0) {
    return 0;
  }
  cVar1 = *p;
  if ((cVar1 != '-') && (cVar1 != '+')) {
    return 0;
  }
  p = p + 1;
  rem = rem - 1;
  iVar4 = match_digits(&hh,&p,&rem,"0509",&local_40);
  if (iVar4 == 0) {
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = match_digits(&hh,&p,&rem,"09",&local_40);
    if (iVar3 == 0) {
      return 0;
    }
  }
  mi = 0;
  if ((rem == 0) || (*p != ':')) {
    match_digits(&mi,&p,&rem,"0509",&local_40);
LAB_0024b2a2:
    ss = 0;
    if ((rem == 0) || (*p != ':')) {
      match_digits(&ss,&p,&rem,"0509",&local_40);
    }
    else {
      p = p + 1;
      rem = rem - 1;
      iVar3 = match_digits(&ss,&p,&rem,"0509",&local_40);
      if (iVar3 == 0) goto LAB_0024b2eb;
    }
    iVar3 = mi * 0x3c + hh * 0xe10 + ss;
    gmtofs_secs = -iVar3;
    if (cVar1 == '+') {
      gmtofs_secs = iVar3;
    }
    pCVar5 = CVmTimeZoneCache::get_gmtofs_zone(G_tzcache_X,gmtofs_secs);
    res->tz = pCVar5;
    res->tzofs = gmtofs_secs * 1000;
    pcVar2 = *str;
    (res->ptz).p = pcVar2;
    (res->ptz).len = (long)p - (long)pcVar2;
    *str = p;
    *len = rem;
    iVar3 = 1;
  }
  else {
    p = p + 1;
    rem = rem - 1;
    iVar3 = match_digits(&mi,&p,&rem,"0509",&local_40);
    if (iVar3 != 0) goto LAB_0024b2a2;
LAB_0024b2eb:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int match_tzofs(VMG_ date_parse_result *res,
                       const char *&str, size_t &len)
{
    const char *p = str;
    size_t rem = len;

    /* first, skip "gmt" if present */
    date_parse_string part;
    int gmtlit = match_lit(p, rem, "^GMT", part);

    /* get the sign */
    if (rem == 0 || (*p != '+' && *p != '-'))
        return FALSE;
    int s = (*p == '+' ? 1 : -1);

    /* skip the sign */
    ++p, --rem;

    /* 
     *   Get the "hh".  If the "GMT" literal was present, allow a single
     *   digit; otherwise require the two-digit format. 
     */
    int hh;
    if (!match_digits(hh, p, rem, "0509", part)
        && (!gmtlit || !match_digits(hh, p, rem, "09", part)))
        return FALSE;

    /* 
     *   check for ":" - if present, the minutes must be present, otherwise
     *   they're optional 
     */
    int mi = 0;
    if (rem != 0 && *p == ':')
    {
        /* skip the ":", then require the minutes */
        ++p, --rem;
        if (!match_digits(mi, p, rem, "0509", part))
            return FALSE;
    }
    else
    {
        /* no ":", so the minuts are optional */
        match_digits(mi, p, rem, "0509", part);
    }

    /* likewise, check for ":ss" */
    int ss = 0;
    if (rem != 0 && *p == ':')
    {
        ++p, --rem;
        if (!match_digits(ss, p, rem, "0509", part))
            return FALSE;
    }
    else
    {
        match_digits(ss, p, rem, "0509", part);
    }

    /* success - figure the offset in seconds */
    int32_t ofs = s * ((hh*60*60) + (mi*60) + ss);

    /* look up the zone by offset */
    res->tz = G_tzcache->get_gmtofs_zone(vmg_ ofs);

    /* also set the explicit offset value (in milliseconds) */
    res->tzofs = ofs * 1000;

    /* set the capture data */
    res->ptz.p = str;
    res->ptz.len = p - str;

    /* advance the caller's vars past the parsed tzofs and return success */
    str = p;
    len = rem;
    return TRUE;
}